

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermReader.h
# Opt level: O0

void aeron::concurrent::logbuffer::TermReader::
     read<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
               (ReadOutcome *outcome,AtomicBuffer *termBuffer,int32_t termOffset,
               function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
               *handler,int fragmentsLimit,Header *header,exception_handler_t *exceptionHandler)

{
  int32_t iVar1;
  bool bVar2;
  index_t iVar3;
  int32_t value;
  int iVar4;
  exception *ex;
  int32_t fragmentOffset;
  int32_t frameLength;
  index_t capacity;
  Header *header_local;
  int fragmentsLimit_local;
  function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
  *handler_local;
  int32_t termOffset_local;
  AtomicBuffer *termBuffer_local;
  ReadOutcome *outcome_local;
  
  outcome->fragmentsRead = 0;
  outcome->offset = termOffset;
  iVar3 = AtomicBuffer::capacity(termBuffer);
  iVar1 = termOffset;
  while ((handler_local._4_4_ = iVar1,
         outcome->fragmentsRead < fragmentsLimit && handler_local._4_4_ < iVar3 &&
         (value = FrameDescriptor::frameLengthVolatile(termBuffer,handler_local._4_4_), 0 < value)))
  {
    iVar4 = util::BitUtil::align<int>(value,0x20);
    bVar2 = FrameDescriptor::isPaddingFrame(termBuffer,handler_local._4_4_);
    iVar1 = handler_local._4_4_ + iVar4;
    if (!bVar2) {
      Header::buffer(header,termBuffer);
      Header::offset(header,handler_local._4_4_);
      std::
      function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
      ::operator()(handler,termBuffer,handler_local._4_4_ + 0x20,value + -0x20,header);
      outcome->fragmentsRead = outcome->fragmentsRead + 1;
    }
  }
  outcome->offset = handler_local._4_4_;
  return;
}

Assistant:

inline void read(
    ReadOutcome& outcome,
    AtomicBuffer& termBuffer,
    std::int32_t termOffset,
    F&& handler,
    int fragmentsLimit,
    Header& header,
    const exception_handler_t & exceptionHandler)
{
    outcome.fragmentsRead = 0;
    outcome.offset = termOffset;
    const util::index_t capacity = termBuffer.capacity();

    try
    {
        while (outcome.fragmentsRead < fragmentsLimit && termOffset < capacity)
        {
            const std::int32_t frameLength = FrameDescriptor::frameLengthVolatile(termBuffer, termOffset);
            if (frameLength <= 0)
            {
                break;
            }

            const std::int32_t fragmentOffset = termOffset;
            termOffset += util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

            if (!FrameDescriptor::isPaddingFrame(termBuffer, fragmentOffset))
            {
                header.buffer(termBuffer);
                header.offset(fragmentOffset);
                handler(termBuffer, fragmentOffset + DataFrameHeader::LENGTH, frameLength - DataFrameHeader::LENGTH, header);

                ++outcome.fragmentsRead;
            }
        }
    }
    catch (const std::exception& ex)
    {
        exceptionHandler(ex);
    }

    outcome.offset = termOffset;
}